

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rstparser.cc
# Opt level: O2

void __thiscall rst::Parser::ParseLineBlock(Parser *this,BlockType *prev_type,int indent)

{
  char cVar1;
  char *pcVar2;
  char *__last;
  char *__first;
  bool bVar3;
  string text;
  
  text._M_dataplus._M_p = (pointer)&text.field_2;
  text._M_string_length = 0;
  text.field_2._M_local_buf[0] = '\0';
  bVar3 = true;
  do {
    __last = this->ptr_;
    __first = __last;
    if (!bVar3) {
      SkipSpace(this);
      pcVar2 = this->ptr_;
      if ((((*pcVar2 != '|') || (0x20 < (ulong)(byte)pcVar2[1])) ||
          ((0x100001a00U >> ((ulong)(byte)pcVar2[1] & 0x3f) & 1) == 0)) ||
         ((long)pcVar2 - (long)__last != (long)indent)) {
LAB_002acc31:
        EnterBlock(this,prev_type,LINE_BLOCK);
        (*this->handler_->_vptr_ContentHandler[2])(this->handler_,1);
        (*this->handler_->_vptr_ContentHandler[4])
                  (this->handler_,text._M_dataplus._M_p,text._M_string_length);
        (*this->handler_->_vptr_ContentHandler[3])();
        std::__cxx11::string::~string((string *)&text);
        return;
      }
      __last = pcVar2 + 2;
      this->ptr_ = __last;
      __first = __last;
      if (pcVar2[2] == '\0') goto LAB_002acc31;
    }
    while (cVar1 = *__last, cVar1 != '\0') {
      __last = __last + 1;
      if (cVar1 == '\n') {
        this->ptr_ = __last;
        break;
      }
      this->ptr_ = __last;
    }
    bVar3 = false;
    std::__cxx11::string::append<char_const*,void>((string *)&text,__first,__last);
  } while( true );
}

Assistant:

void rst::Parser::ParseLineBlock(rst::BlockType &prev_type, int indent) {
  std::string text;
  for (bool first = true; ; first = false) {
    const char *line_start = ptr_;
    if (!first) {
      // Check indentation.
      SkipSpace();
      if (*ptr_ != '|' || !IsSpace(ptr_[1]) || ptr_ - line_start != indent)
        break;
      ptr_ += 2;
      if (!*ptr_)
        break;  // End of input.
    }
    // Strip indentation.
    line_start = ptr_;

    // Find the end of the line.
    while (*ptr_ && *ptr_ != '\n')
      ++ptr_;
    if (*ptr_ == '\n')
      ++ptr_;
    text.append(line_start, ptr_);
  }

  EnterBlock(prev_type, rst::LINE_BLOCK);
  handler_->StartBlock(rst::LINE_BLOCK);
  handler_->HandleText(text.c_str(), text.size());
  handler_->EndBlock();
}